

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  uint uVar342;
  ulong uVar343;
  long lVar344;
  ulong uVar345;
  ulong uVar346;
  ulong uVar347;
  ulong uVar348;
  long lVar349;
  ulong uVar350;
  ulong uVar351;
  ulong uVar352;
  ulong uVar353;
  ulong uVar354;
  ulong uVar355;
  uint16_t *a_00;
  secp256k1_fe *a_01;
  secp256k1_fe *r;
  secp256k1_fe *psVar356;
  ulong uVar357;
  ulong uVar358;
  ulong uVar359;
  ulong uVar360;
  ulong uVar361;
  ulong uVar362;
  ulong uVar363;
  secp256k1_fe c;
  secp256k1_fe bn;
  secp256k1_fe an;
  uint16_t t16 [32];
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  secp256k1_fe sStack_240;
  secp256k1_fe sStack_218;
  secp256k1_fe *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_fe *psStack_1e0;
  secp256k1_fe *local_1d0;
  secp256k1_fe local_1c8;
  secp256k1_fe local_198;
  secp256k1_fe local_168;
  secp256k1_fe local_138;
  ushort auStack_f8 [16];
  uint16_t local_d8 [16];
  uint16_t local_b8 [16];
  ushort local_98 [16];
  ushort local_78 [16];
  ushort local_58 [20];
  
  uVar359 = a->n[0];
  uVar350 = a->n[1];
  uVar361 = a->n[2];
  uVar3 = a->n[3];
  uVar354 = a->n[4];
  if (use_sqr == 0) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = b->n[0];
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar3;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = b->n[1];
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar361;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = b->n[2];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar350;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = b->n[3];
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar359;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = b->n[4];
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar354;
    uVar343 = SUB168(auVar28 * auVar184,0);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar343 & 0xfffffffffffff;
    auVar24 = auVar25 * auVar181 + auVar24 * auVar180 + auVar26 * auVar182 + auVar27 * auVar183 +
              auVar29 * ZEXT816(0x1000003d10);
    uVar353 = auVar24._0_8_;
    local_138.n[0] = uVar353 & 0xfffffffffffff;
    auVar307._8_8_ = 0;
    auVar307._0_8_ = uVar353 >> 0x34 | auVar24._8_8_ << 0xc;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = b->n[0];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar354;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = b->n[1];
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar3;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = b->n[2];
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar361;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = b->n[3];
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar350;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = b->n[4];
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar359;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar343 >> 0x34 | SUB168(auVar28 * auVar184,8) << 0xc;
    auVar24 = auVar30 * auVar185 + auVar307 + auVar31 * auVar186 + auVar32 * auVar187 +
              auVar33 * auVar188 + auVar34 * auVar189 + auVar35 * ZEXT816(0x1000003d10);
    uVar343 = auVar24._0_8_;
    auVar308._8_8_ = 0;
    auVar308._0_8_ = uVar343 >> 0x34 | auVar24._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = b->n[0];
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar359;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = b->n[1];
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar354;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = b->n[2];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = b->n[3];
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar361;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = b->n[4];
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar350;
    auVar24 = auVar37 * auVar191 + auVar308 + auVar38 * auVar192 + auVar39 * auVar193 +
              auVar40 * auVar194;
    uVar353 = auVar24._0_8_;
    auVar310._8_8_ = 0;
    auVar310._0_8_ = uVar353 >> 0x34 | auVar24._8_8_ << 0xc;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = (uVar353 & 0xfffffffffffff) << 4 | (uVar343 & 0xfffffffffffff) >> 0x30;
    uVar357 = auVar4._0_8_;
    auVar4 = auVar36 * auVar190 + ZEXT816(0x1000003d1) * auVar195;
    auVar309._8_8_ = 0;
    auVar309._0_8_ = uVar357 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = b->n[0];
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar350;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = b->n[1];
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar359;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = b->n[2];
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar354;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = b->n[3];
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar3;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = b->n[4];
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar361;
    auVar25 = auVar43 * auVar198 + auVar310 + auVar44 * auVar199 + auVar45 * auVar200;
    uVar353 = auVar25._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar353 & 0xfffffffffffff;
    auVar24 = auVar41 * auVar196 + auVar309 + auVar42 * auVar197 + auVar46 * ZEXT816(0x1000003d10);
    uVar358 = auVar24._0_8_;
    auVar312._8_8_ = 0;
    auVar312._0_8_ = uVar353 >> 0x34 | auVar25._8_8_ << 0xc;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = uVar358 >> 0x34 | auVar24._8_8_ << 0xc;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = b->n[0];
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar361;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = b->n[1];
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar350;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = b->n[2];
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar359;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = b->n[3];
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar354;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = b->n[4];
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar3;
    auVar25 = auVar50 * auVar204 + auVar312 + auVar51 * auVar205;
    uVar354 = auVar25._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar354 & 0xfffffffffffff;
    auVar24 = auVar47 * auVar201 + auVar311 + auVar48 * auVar202 + auVar49 * auVar203 +
              auVar52 * ZEXT816(0x1000003d10);
    uVar359 = auVar24._0_8_;
    auVar313._8_8_ = 0;
    auVar313._0_8_ = (uVar359 >> 0x34 | auVar24._8_8_ << 0xc) + local_138.n[0];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar354 >> 0x34 | auVar25._8_8_ << 0xc;
    auVar313 = auVar53 * ZEXT816(0x1000003d10) + auVar313;
    uVar354 = auVar313._0_8_;
    local_1c8.n[4] = (uVar354 >> 0x34 | auVar313._8_8_ << 0xc) + (uVar343 & 0xffffffffffff);
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar359 * 2;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar3;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar350 * 2;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar361;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar354;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar354;
    uVar343 = SUB168(auVar6 * auVar166,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar343 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar165 + auVar4 * auVar164 + auVar7 * ZEXT816(0x1000003d10);
    uVar353 = auVar4._0_8_;
    local_138.n[0] = uVar353 & 0xfffffffffffff;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar353 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar354 = uVar354 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar359;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar354;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar350 * 2;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar3;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar361;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar361;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar343 >> 0x34 | SUB168(auVar6 * auVar166,8) << 0xc;
    auVar4 = auVar8 * auVar167 + auVar300 + auVar9 * auVar168 + auVar10 * auVar169 +
             auVar11 * ZEXT816(0x1000003d10);
    uVar343 = auVar4._0_8_;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = uVar343 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar359;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar359;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar350;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar354;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar361 * 2;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar3;
    auVar4 = auVar13 * auVar171 + auVar301 + auVar14 * auVar172;
    uVar353 = auVar4._0_8_;
    auVar303._8_8_ = 0;
    auVar303._0_8_ = uVar353 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (uVar353 & 0xfffffffffffff) << 4 | (uVar343 & 0xfffffffffffff) >> 0x30;
    uVar357 = auVar24._0_8_;
    auVar24 = auVar12 * auVar170 + ZEXT816(0x1000003d1) * auVar173;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = uVar357 >> 0x34 | auVar24._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar359 * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar350;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar361;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar354;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar3;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar3;
    auVar25 = auVar16 * auVar175 + auVar303 + auVar17 * auVar176;
    uVar353 = auVar25._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar353 & 0xfffffffffffff;
    auVar4 = auVar15 * auVar174 + auVar302 + auVar18 * ZEXT816(0x1000003d10);
    uVar358 = auVar4._0_8_;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = uVar353 >> 0x34 | auVar25._8_8_ << 0xc;
    auVar304._8_8_ = 0;
    auVar304._0_8_ = uVar358 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar359 * 2;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar361;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar350;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar350;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar3;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar354;
    auVar305 = auVar21 * auVar179 + auVar305;
    uVar354 = auVar305._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar354 & 0xfffffffffffff;
    auVar4 = auVar19 * auVar177 + auVar304 + auVar20 * auVar178 + auVar22 * ZEXT816(0x1000003d10);
    uVar359 = auVar4._0_8_;
    auVar306._8_8_ = 0;
    auVar306._0_8_ = (uVar359 >> 0x34 | auVar4._8_8_ << 0xc) + local_138.n[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar354 >> 0x34 | auVar305._8_8_ << 0xc;
    auVar306 = auVar23 * ZEXT816(0x1000003d10) + auVar306;
    uVar354 = auVar306._0_8_;
    local_1c8.n[4] = (uVar354 >> 0x34 | auVar306._8_8_ << 0xc) + (uVar343 & 0xffffffffffff);
  }
  local_1c8.n[3] = uVar354 & 0xfffffffffffff;
  local_1c8.n[2] = uVar359 & 0xfffffffffffff;
  local_1c8.n[1] = uVar358 & 0xfffffffffffff;
  local_1c8.n[0] = uVar357 & 0xfffffffffffff;
  local_168.n[4] = a->n[4];
  local_168.n[0] = a->n[0];
  local_168.n[1] = a->n[1];
  local_168.n[2] = a->n[2];
  local_168.n[3] = a->n[3];
  local_198.n[0] = b->n[0];
  local_198.n[1] = b->n[1];
  local_198.n[2] = b->n[2];
  local_198.n[3] = b->n[3];
  local_198.n[4] = b->n[4];
  psStack_1e0 = (secp256k1_fe *)0x15fc5d;
  local_1d0 = b;
  secp256k1_fe_impl_normalize_var(&local_1c8);
  psStack_1e0 = (secp256k1_fe *)0x15fc65;
  secp256k1_fe_impl_normalize_var(&local_168);
  psStack_1e0 = (secp256k1_fe *)0x15fc6d;
  secp256k1_fe_impl_normalize_var(&local_198);
  psStack_1e0 = (secp256k1_fe *)0x15fc7d;
  secp256k1_fe_impl_get_b32((uchar *)local_58,&local_168);
  psStack_1e0 = (secp256k1_fe *)0x15fc8d;
  secp256k1_fe_impl_get_b32((uchar *)local_78,&local_198);
  psStack_1e0 = (secp256k1_fe *)0x15fc9d;
  secp256k1_fe_impl_get_b32((uchar *)local_98,&local_1c8);
  lVar344 = 0x10;
  lVar349 = 0;
  do {
    uVar1 = local_78[lVar344 + -1];
    *(ushort *)((long)local_b8 + lVar349) =
         local_58[lVar344 + -1] << 8 | local_58[lVar344 + -1] >> 8;
    uVar2 = local_98[lVar344 + -1];
    *(ushort *)((long)local_d8 + lVar349) = uVar1 << 8 | uVar1 >> 8;
    *(ushort *)((long)auStack_f8 + lVar349) = uVar2 << 8 | uVar2 >> 8;
    lVar349 = lVar349 + 2;
    lVar344 = lVar344 + -1;
  } while (lVar344 != 0);
  a_01 = &local_138;
  a_00 = local_b8;
  psStack_1e0 = (secp256k1_fe *)0x15fd0d;
  mulmod256((uint16_t *)a_01,a_00,local_d8,test_fe_mul::m16);
  lVar344 = 0;
  while (*(char *)((long)local_138.n + lVar344) == *(char *)((long)auStack_f8 + lVar344)) {
    lVar344 = lVar344 + 1;
    if (lVar344 == 0x20) {
      return;
    }
  }
  psStack_1e0 = (secp256k1_fe *)test_sqrt;
  test_fe_mul_cold_1();
  psVar356 = &sStack_240;
  r = &sStack_218;
  psStack_1f0 = &local_168;
  psStack_1e8 = &local_198;
  psStack_1e0 = &local_1c8;
  uVar342 = secp256k1_fe_sqrt(r,a_01);
  if (uVar342 != (a_00 == (uint16_t *)0x0)) {
    if (a_00 != (uint16_t *)0x0) {
      sStack_240.n[0] = (*(long *)a_00 - sStack_218.n[0]) + 0x3ffffbfffff0bc;
      a_01 = (secp256k1_fe *)0x3ffffffffffffc;
      sStack_240.n[1] = (*(long *)(a_00 + 4) - sStack_218.n[1]) + 0x3ffffffffffffc;
      sStack_240.n[2] = (*(long *)(a_00 + 8) - sStack_218.n[2]) + 0x3ffffffffffffc;
      sStack_240.n[3] = (*(long *)(a_00 + 0xc) - sStack_218.n[3]) + 0x3ffffffffffffc;
      sStack_240.n[4] = (*(long *)(a_00 + 0x10) - sStack_218.n[4]) + 0x3fffffffffffc;
      sStack_218.n[0] = *(long *)a_00 + sStack_218.n[0];
      sStack_218.n[1] = *(long *)(a_00 + 4) + sStack_218.n[1];
      sStack_218.n[2] = *(long *)(a_00 + 8) + sStack_218.n[2];
      sStack_218.n[3] = *(long *)(a_00 + 0xc) + sStack_218.n[3];
      sStack_218.n[4] = *(long *)(a_00 + 0x10) + sStack_218.n[4];
      secp256k1_fe_impl_normalize(&sStack_218);
      secp256k1_fe_impl_normalize(&sStack_240);
      if ((((sStack_218.n[3] != 0 || sStack_218.n[1] != 0) ||
           (sStack_218.n[2] != 0 || sStack_218.n[0] != 0)) || sStack_218.n[4] != 0) &&
         (r = psVar356,
         ((sStack_240.n[3] != 0 || sStack_240.n[1] != 0) ||
         (sStack_240.n[2] != 0 || sStack_240.n[0] != 0)) || sStack_240.n[4] != 0))
      goto LAB_0015fe79;
    }
    return;
  }
  test_sqrt_cold_2();
LAB_0015fe79:
  test_sqrt_cold_1();
  psVar356 = r + 2;
  random_fe_non_zero_test(psVar356);
  uVar354 = psVar356->n[0];
  uVar359 = r[2].n[1];
  uVar350 = r[2].n[2];
  uVar361 = r[2].n[3];
  uVar3 = r[2].n[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar354 * 2;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar361;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar359 * 2;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar350;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar3;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar3;
  uVar343 = SUB168(auVar56 * auVar208,0);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar343 & 0xfffffffffffff;
  auVar24 = auVar55 * auVar207 + auVar54 * auVar206 + auVar57 * ZEXT816(0x1000003d10);
  uVar358 = auVar24._0_8_;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar358 >> 0x34 | auVar24._8_8_ << 0xc;
  uVar3 = uVar3 * 2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar354;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar3;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar359 * 2;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar361;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar350;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar350;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar343 >> 0x34 | SUB168(auVar56 * auVar208,8) << 0xc;
  auVar24 = auVar58 * auVar209 + auVar314 + auVar59 * auVar210 + auVar60 * auVar211 +
            auVar61 * ZEXT816(0x1000003d10);
  uVar355 = auVar24._0_8_;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar355 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar354;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar354;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar359;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar3;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar350 * 2;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar361;
  auVar24 = auVar63 * auVar213 + auVar315 + auVar64 * auVar214;
  uVar343 = auVar24._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar343 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = (uVar343 & 0xfffffffffffff) << 4 | (uVar355 & 0xfffffffffffff) >> 0x30;
  auVar24 = auVar62 * auVar212 + ZEXT816(0x1000003d1) * auVar215;
  uVar353 = auVar24._0_8_;
  uVar343 = uVar353 & 0xfffffffffffff;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar353 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar354 * 2;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar359;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar350;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar3;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar361;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar361;
  auVar4 = auVar66 * auVar217 + auVar317 + auVar67 * auVar218;
  uVar353 = auVar4._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar353 & 0xfffffffffffff;
  auVar24 = auVar65 * auVar216 + auVar316 + auVar68 * ZEXT816(0x1000003d10);
  uVar357 = auVar24._0_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar353 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar353 = uVar357 & 0xfffffffffffff;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar357 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar354 * 2;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar350;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar359;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar359;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar361;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar3;
  auVar319 = auVar71 * auVar221 + auVar319;
  uVar354 = auVar319._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar354 & 0xfffffffffffff;
  auVar24 = auVar69 * auVar219 + auVar318 + auVar70 * auVar220 + auVar72 * ZEXT816(0x1000003d10);
  uVar359 = auVar24._0_8_;
  uVar357 = uVar359 & 0xfffffffffffff;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = (uVar359 >> 0x34 | auVar24._8_8_ << 0xc) + (uVar358 & 0xfffffffffffff);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar354 >> 0x34 | auVar319._8_8_ << 0xc;
  auVar320 = auVar73 * ZEXT816(0x1000003d10) + auVar320;
  uVar354 = auVar320._0_8_;
  uVar358 = uVar354 & 0xfffffffffffff;
  uVar360 = (uVar354 >> 0x34 | auVar320._8_8_ << 0xc) + (uVar355 & 0xffffffffffff);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = psVar356->n[0];
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar358;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = r[2].n[1];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar357;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = r[2].n[2];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar353;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = r[2].n[3];
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar343;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = r[2].n[4];
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar360;
  uVar354 = SUB168(auVar78 * auVar226,0);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar354 & 0xfffffffffffff;
  auVar24 = auVar75 * auVar223 + auVar74 * auVar222 + auVar76 * auVar224 + auVar77 * auVar225 +
            auVar79 * ZEXT816(0x1000003d10);
  uVar359 = auVar24._0_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar359 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = psVar356->n[0];
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar360;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = r[2].n[1];
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar358;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = r[2].n[2];
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar357;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = r[2].n[3];
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar353;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = r[2].n[4];
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar343;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar354 >> 0x34 | SUB168(auVar78 * auVar226,8) << 0xc;
  auVar24 = auVar80 * auVar227 + auVar321 + auVar81 * auVar228 + auVar82 * auVar229 +
            auVar83 * auVar230 + auVar84 * auVar231 + auVar85 * ZEXT816(0x1000003d10);
  uVar354 = auVar24._0_8_;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar354 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = psVar356->n[0];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar343;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = r[2].n[1];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar360;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = r[2].n[2];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar358;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = r[2].n[3];
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar357;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = r[2].n[4];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar353;
  auVar24 = auVar87 * auVar233 + auVar322 + auVar88 * auVar234 + auVar89 * auVar235 +
            auVar90 * auVar236;
  uVar350 = auVar24._0_8_;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar350 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = (uVar350 & 0xfffffffffffff) << 4 | (uVar354 & 0xfffffffffffff) >> 0x30;
  auVar24 = auVar86 * auVar232 + ZEXT816(0x1000003d1) * auVar237;
  uVar350 = auVar24._0_8_;
  uVar355 = uVar350 & 0xfffffffffffff;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar350 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = psVar356->n[0];
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar353;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = r[2].n[1];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar343;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = r[2].n[2];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar360;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = r[2].n[3];
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar358;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = r[2].n[4];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar357;
  auVar4 = auVar93 * auVar240 + auVar324 + auVar94 * auVar241 + auVar95 * auVar242;
  uVar350 = auVar4._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar350 & 0xfffffffffffff;
  auVar24 = auVar91 * auVar238 + auVar323 + auVar92 * auVar239 + auVar96 * ZEXT816(0x1000003d10);
  uVar361 = auVar24._0_8_;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar345 = uVar361 & 0xfffffffffffff;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar361 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = psVar356->n[0];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar357;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = r[2].n[1];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar353;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = r[2].n[2];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar343;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = r[2].n[3];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar360;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = r[2].n[4];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar358;
  auVar4 = auVar100 * auVar246 + auVar326 + auVar101 * auVar247;
  uVar350 = auVar4._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar350 & 0xfffffffffffff;
  auVar24 = auVar97 * auVar243 + auVar325 + auVar98 * auVar244 + auVar99 * auVar245 +
            auVar102 * ZEXT816(0x1000003d10);
  uVar361 = auVar24._0_8_;
  uVar346 = uVar361 & 0xfffffffffffff;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = (uVar361 >> 0x34 | auVar24._8_8_ << 0xc) + (uVar359 & 0xfffffffffffff);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar327 = auVar103 * ZEXT816(0x1000003d10) + auVar327;
  uVar359 = auVar327._0_8_;
  uVar347 = uVar359 & 0xfffffffffffff;
  uVar362 = (uVar359 >> 0x34 | auVar327._8_8_ << 0xc) + (uVar354 & 0xffffffffffff);
  uVar354 = a_01->n[0];
  uVar359 = a_01->n[1];
  uVar350 = a_01->n[2];
  uVar361 = a_01->n[3];
  uVar3 = a_01->n[4];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar343;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar361;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar353;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar350;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar357;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar359;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar358;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar354;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar360;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar3;
  uVar348 = SUB168(auVar108 * auVar252,0);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar348 & 0xfffffffffffff;
  auVar24 = auVar105 * auVar249 + auVar104 * auVar248 + auVar106 * auVar250 + auVar107 * auVar251 +
            auVar109 * ZEXT816(0x1000003d10);
  uVar351 = auVar24._0_8_;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar351 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar343;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar3;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar353;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar361;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar357;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar350;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar358;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar359;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar360;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar354;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar348 >> 0x34 | SUB168(auVar108 * auVar252,8) << 0xc;
  auVar24 = auVar110 * auVar253 + auVar328 + auVar111 * auVar254 + auVar112 * auVar255 +
            auVar113 * auVar256 + auVar114 * auVar257 + auVar115 * ZEXT816(0x1000003d10);
  uVar348 = auVar24._0_8_;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar348 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar343;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar354;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar353;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar3;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar357;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar361;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar358;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar350;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar360;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar359;
  auVar24 = auVar117 * auVar259 + auVar329 + auVar118 * auVar260 + auVar119 * auVar261 +
            auVar120 * auVar262;
  uVar352 = auVar24._0_8_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar352 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = (uVar352 & 0xfffffffffffff) << 4 | (uVar348 & 0xfffffffffffff) >> 0x30;
  auVar24 = auVar116 * auVar258 + ZEXT816(0x1000003d1) * auVar263;
  uVar352 = auVar24._0_8_;
  r->n[0] = uVar352 & 0xfffffffffffff;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar352 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar343;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar359;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar353;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar354;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar357;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar3;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar358;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar361;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar360;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar350;
  auVar4 = auVar123 * auVar266 + auVar331 + auVar124 * auVar267 + auVar125 * auVar268;
  uVar352 = auVar4._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar352 & 0xfffffffffffff;
  auVar24 = auVar121 * auVar264 + auVar330 + auVar122 * auVar265 + auVar126 * ZEXT816(0x1000003d10);
  uVar363 = auVar24._0_8_;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar352 >> 0x34 | auVar4._8_8_ << 0xc;
  r->n[1] = uVar363 & 0xfffffffffffff;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar363 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar343;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar350;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar353;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar359;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar357;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar354;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar358;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar3;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar360;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar361;
  auVar4 = auVar130 * auVar272 + auVar333 + auVar131 * auVar273;
  uVar354 = auVar4._0_8_;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar354 & 0xfffffffffffff;
  auVar24 = auVar127 * auVar269 + auVar332 + auVar128 * auVar270 + auVar129 * auVar271 +
            auVar132 * ZEXT816(0x1000003d10);
  uVar359 = auVar24._0_8_;
  r->n[2] = uVar359 & 0xfffffffffffff;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = (uVar359 >> 0x34 | auVar24._8_8_ << 0xc) + (uVar351 & 0xfffffffffffff);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar354 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar334 = auVar133 * ZEXT816(0x1000003d10) + auVar334;
  uVar354 = auVar334._0_8_;
  r->n[3] = uVar354 & 0xfffffffffffff;
  r->n[4] = (uVar354 >> 0x34 | auVar334._8_8_ << 0xc) + (uVar348 & 0xffffffffffff);
  uVar354 = a_01[1].n[0];
  uVar359 = a_01[1].n[1];
  uVar350 = a_01[1].n[2];
  uVar361 = a_01[1].n[3];
  uVar3 = a_01[1].n[4];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar355;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar361;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar345;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar350;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar346;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar359;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar347;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar354;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar362;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar3;
  uVar343 = SUB168(auVar138 * auVar278,0);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar343 & 0xfffffffffffff;
  auVar24 = auVar135 * auVar275 + auVar134 * auVar274 + auVar136 * auVar276 + auVar137 * auVar277 +
            auVar139 * ZEXT816(0x1000003d10);
  uVar353 = auVar24._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar353 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar355;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar3;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar345;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar361;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar346;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar350;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar347;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar359;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar362;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar354;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar343 >> 0x34 | SUB168(auVar138 * auVar278,8) << 0xc;
  auVar24 = auVar140 * auVar279 + auVar335 + auVar141 * auVar280 + auVar142 * auVar281 +
            auVar143 * auVar282 + auVar144 * auVar283 + auVar145 * ZEXT816(0x1000003d10);
  uVar343 = auVar24._0_8_;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar343 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar355;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar354;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar345;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar3;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar346;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar361;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar347;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar350;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar362;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar359;
  auVar24 = auVar147 * auVar285 + auVar336 + auVar148 * auVar286 + auVar149 * auVar287 +
            auVar150 * auVar288;
  uVar357 = auVar24._0_8_;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar357 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = (uVar357 & 0xfffffffffffff) << 4 | (uVar343 & 0xfffffffffffff) >> 0x30;
  auVar24 = auVar146 * auVar284 + ZEXT816(0x1000003d1) * auVar289;
  uVar357 = auVar24._0_8_;
  r[1].n[0] = uVar357 & 0xfffffffffffff;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar357 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar355;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar359;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar345;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar354;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar346;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar3;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar347;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar361;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar362;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar350;
  auVar4 = auVar153 * auVar292 + auVar338 + auVar154 * auVar293 + auVar155 * auVar294;
  uVar357 = auVar4._0_8_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar357 & 0xfffffffffffff;
  auVar24 = auVar151 * auVar290 + auVar337 + auVar152 * auVar291 + auVar156 * ZEXT816(0x1000003d10);
  uVar358 = auVar24._0_8_;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar357 >> 0x34 | auVar4._8_8_ << 0xc;
  r[1].n[1] = uVar358 & 0xfffffffffffff;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar358 >> 0x34 | auVar24._8_8_ << 0xc;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar355;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar350;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar345;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar359;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar346;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar354;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar347;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar3;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar362;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar361;
  auVar4 = auVar160 * auVar298 + auVar340 + auVar161 * auVar299;
  uVar354 = auVar4._0_8_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar354 & 0xfffffffffffff;
  auVar24 = auVar157 * auVar295 + auVar339 + auVar158 * auVar296 + auVar159 * auVar297 +
            auVar162 * ZEXT816(0x1000003d10);
  uVar359 = auVar24._0_8_;
  r[1].n[2] = uVar359 & 0xfffffffffffff;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = (uVar359 >> 0x34 | auVar24._8_8_ << 0xc) + (uVar353 & 0xfffffffffffff);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar354 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar341 = auVar163 * ZEXT816(0x1000003d10) + auVar341;
  uVar354 = auVar341._0_8_;
  r[1].n[3] = uVar354 & 0xfffffffffffff;
  r[1].n[4] = (uVar354 >> 0x34 | auVar341._8_8_ << 0xc) + (uVar343 & 0xffffffffffff);
  *(int *)r[3].n = (int)a_01[2].n[0];
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}